

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.cpp
# Opt level: O3

string * __thiscall
iDynTree::Transform::toString_abi_cxx11_(string *__return_storage_ptr__,Transform *this)

{
  char cVar1;
  ostream *poVar2;
  stringstream ss;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  long local_198 [14];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  Rotation::toString_abi_cxx11_(&local_1c8,&this->rot);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  Position::toString_abi_cxx11_(&local_1e8,&this->pos);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  cVar1 = (char)(ostream *)local_198;
  std::ios::widen((char)*(undefined8 *)(local_198[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string Transform::toString() const
{
    std::stringstream ss;

    ss << rot.toString() << " "
       << pos.toString();

    ss << std::endl;

    return ss.str();
}